

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.cpp
# Opt level: O0

Complex __thiscall libDAI::IJGP::logZ(IJGP *this)

{
  int iVar1;
  TFactor<double> *pTVar2;
  Region *this_00;
  undefined4 extraout_var;
  void *pvVar3;
  FRegion *this_01;
  undefined4 extraout_var_00;
  void *extraout_RDX;
  undefined8 extraout_RDX_00;
  void *extraout_RDX_01;
  TFactor<double> *Q;
  void *pvVar4;
  TFactor<double> *in_RDI;
  pointer *this_02;
  double dVar5;
  undefined8 uVar6;
  Complex CVar7;
  size_t alpha;
  size_t beta;
  Complex sum;
  complex<double> *in_stack_fffffffffffffeb8;
  RegionGraph *in_stack_fffffffffffffec0;
  TFactor<double> *in_stack_fffffffffffffef8;
  complex<double> local_78;
  double local_68;
  undefined8 local_60;
  void *local_58;
  double local_50;
  undefined8 local_48;
  complex<double> local_40;
  double local_30;
  undefined8 local_28;
  TFactor<double> *pTVar8;
  TFactor<double> *this_03;
  complex<double> local_10;
  
  this_03 = in_RDI;
  std::complex<double>::complex(&local_10,0.0,0.0);
  pTVar8 = (TFactor<double> *)0x0;
  while( true ) {
    Q = pTVar8;
    (*(code *)(in_RDI->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start[2]._label)();
    pTVar2 = (TFactor<double> *)RegionGraph::nr_IRs((RegionGraph *)0xb5979d);
    if (pTVar2 <= pTVar8) break;
    (*(code *)(in_RDI->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start[2]._label)();
    pTVar8 = Q;
    this_00 = RegionGraph::IR(in_stack_fffffffffffffec0,(long)in_stack_fffffffffffffeb8);
    iVar1 = Region::c(this_00,Q,extraout_RDX);
    dVar5 = *(double *)CONCAT44(extraout_var,iVar1);
    uVar6 = 0;
    std::complex<double>::complex(&local_40,dVar5,0.0);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               &in_RDI[10]._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)pTVar8);
    TFactor<double>::entropy((TFactor<double> *)0xb59807);
    local_50 = dVar5;
    local_48 = uVar6;
    std::operator*(in_stack_fffffffffffffeb8,(complex<double> *)0xb5982e);
    local_30 = dVar5;
    local_28 = uVar6;
    std::complex<double>::operator+=
              ((complex<double> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    pTVar8 = (TFactor<double> *)
             ((long)&(pTVar8->_vs)._vars.
                     super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                     super__Vector_impl_data._M_start + 1);
  }
  local_58 = (void *)0x0;
  while( true ) {
    pvVar4 = local_58;
    (*(code *)(in_RDI->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start[2]._label)();
    pvVar3 = (void *)RegionGraph::nr_ORs((RegionGraph *)0xb5989a);
    if (pvVar3 <= pvVar4) break;
    (*(code *)(in_RDI->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start[2]._label)();
    pvVar4 = local_58;
    this_01 = RegionGraph::OR(in_stack_fffffffffffffec0,(long)in_stack_fffffffffffffeb8);
    iVar1 = FRegion::c(this_01,pvVar4,extraout_RDX_01);
    dVar5 = *(double *)CONCAT44(extraout_var_00,iVar1);
    uVar6 = 0;
    std::complex<double>::complex(&local_78,dVar5,0.0);
    this_02 = &in_RDI[9]._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)this_02
               ,(size_type)local_58);
    TFactor<double>::entropy((TFactor<double> *)0xb59911);
    std::operator*(in_stack_fffffffffffffeb8,(complex<double> *)0xb59935);
    local_68 = dVar5;
    local_60 = uVar6;
    std::complex<double>::operator+=
              ((complex<double> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    (*(code *)(in_RDI->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start[2]._label)();
    RegionGraph::OR(in_stack_fffffffffffffec0,(long)in_stack_fffffffffffffeb8);
    TFactor<double>::log0(in_stack_fffffffffffffef8);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)this_02
               ,(size_type)local_58);
    TFactor<double>::operator*(this_03,Q);
    in_stack_fffffffffffffec0 =
         (RegionGraph *)TFactor<double>::totalSum((TFactor<double> *)0xb599c2);
    std::complex<double>::operator+=(&local_10,(double)in_stack_fffffffffffffec0);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffec0);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffec0);
    local_58 = (void *)((long)local_58 + 1);
  }
  CVar7._M_value._8_8_ = extraout_RDX_00;
  CVar7._M_value._0_8_ = pvVar4;
  return (Complex)CVar7._M_value;
}

Assistant:

Complex IJGP::logZ() const {
        Complex sum = 0.0;
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            sum += Complex(grm().IR(beta).c()) * _Qb[beta].entropy();
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ ) {
            sum += Complex(grm().OR(alpha).c()) * _Qa[alpha].entropy();
            sum += (grm().OR(alpha).log0() * _Qa[alpha]).totalSum();
        }
        return sum;
    }